

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadgamma.hpp
# Opt level: O3

vector<TensorEntry,_std::allocator<TensorEntry>_> *
symmetric_fold(vector<TensorEntry,_std::allocator<TensorEntry>_> *__return_storage_ptr__,
              vector<TensorEntry,_std::allocator<TensorEntry>_> *v)

{
  pointer *ppTVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  pointer pTVar5;
  iterator iVar6;
  undefined2 uVar7;
  undefined2 uVar8;
  undefined2 uVar9;
  pointer pTVar10;
  TensorEntry local_40;
  float local_34;
  
  (__return_storage_ptr__->super__Vector_base<TensorEntry,_std::allocator<TensorEntry>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<TensorEntry,_std::allocator<TensorEntry>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<TensorEntry,_std::allocator<TensorEntry>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar5 = (v->super__Vector_base<TensorEntry,_std::allocator<TensorEntry>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pTVar10 = (v->super__Vector_base<TensorEntry,_std::allocator<TensorEntry>_>)._M_impl.
                 super__Vector_impl_data._M_start; pTVar10 != pTVar5; pTVar10 = pTVar10 + 1) {
    sVar2 = pTVar10->a;
    sVar3 = pTVar10->b;
    sVar4 = pTVar10->c;
    uVar7 = pTVar10->a;
    uVar8 = pTVar10->b;
    uVar9 = pTVar10->c;
    local_34 = pTVar10->val;
    if (sVar2 < sVar3) {
      local_40.val = local_34 + local_34;
      iVar6._M_current =
           (__return_storage_ptr__->super__Vector_base<TensorEntry,_std::allocator<TensorEntry>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (__return_storage_ptr__->super__Vector_base<TensorEntry,_std::allocator<TensorEntry>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_40.a = sVar2;
        local_40.b = sVar3;
        local_40.c = sVar4;
        std::vector<TensorEntry,_std::allocator<TensorEntry>_>::_M_realloc_insert<TensorEntry>
                  (__return_storage_ptr__,iVar6,&local_40);
      }
      else {
        (iVar6._M_current)->val = local_40.val;
        (iVar6._M_current)->a = uVar7;
        (iVar6._M_current)->b = uVar8;
        (iVar6._M_current)->c = uVar9;
        *(undefined2 *)&(iVar6._M_current)->field_0x6 = local_40._6_2_;
        ppTVar1 = &(__return_storage_ptr__->
                   super__Vector_base<TensorEntry,_std::allocator<TensorEntry>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppTVar1 = *ppTVar1 + 1;
      }
    }
    if (sVar2 == sVar3) {
      local_40.val = local_34;
      iVar6._M_current =
           (__return_storage_ptr__->super__Vector_base<TensorEntry,_std::allocator<TensorEntry>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (__return_storage_ptr__->super__Vector_base<TensorEntry,_std::allocator<TensorEntry>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_40.a = sVar2;
        local_40.b = sVar2;
        local_40.c = sVar4;
        std::vector<TensorEntry,_std::allocator<TensorEntry>_>::_M_realloc_insert<TensorEntry>
                  (__return_storage_ptr__,iVar6,&local_40);
      }
      else {
        (iVar6._M_current)->val = local_34;
        (iVar6._M_current)->a = sVar2;
        (iVar6._M_current)->b = sVar2;
        (iVar6._M_current)->c = sVar4;
        *(undefined2 *)&(iVar6._M_current)->field_0x6 = local_40._6_2_;
        ppTVar1 = &(__return_storage_ptr__->
                   super__Vector_base<TensorEntry,_std::allocator<TensorEntry>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppTVar1 = *ppTVar1 + 1;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<TensorEntry> symmetric_fold(std::vector<TensorEntry> v)
{
	std::vector<TensorEntry> res;
	for (auto e: v) {
		if (e.a < e.b)
			res.push_back({e.a, e.b, e.c, e.val*2});
		if (e.a == e.b)
			res.push_back({e.a, e.b, e.c, e.val});
	}
	return res;
}